

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O3

void __thiscall checkqueue_tests::test_CheckQueue_Memory::test_method(test_CheckQueue_Memory *this)

{
  long lVar1;
  __uniq_ptr_data<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>,_true,_true>
  this_00;
  uint64_t uVar2;
  iterator in_R8;
  iterator in_R9;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  long local_120;
  lazy_ostream local_100;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  __single_object queue;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  char *local_80;
  char *local_78;
  assertion_result local_70;
  CCheckQueueControl<MemoryCheck> control;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.
  super___uniq_ptr_impl<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>.
  _M_t.
  super__Tuple_impl<0UL,_CCheckQueue<MemoryCheck>_*,_std::default_delete<CCheckQueue<MemoryCheck>_>_>
  .super__Head_base<0UL,_CCheckQueue<MemoryCheck>_*,_false>._M_head_impl =
       (__uniq_ptr_impl<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>)
       operator_new(0x100);
  CCheckQueue<MemoryCheck>::CCheckQueue
            ((CCheckQueue<MemoryCheck> *)
             this_00.
             super___uniq_ptr_impl<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_CCheckQueue<MemoryCheck>_*,_std::default_delete<CCheckQueue<MemoryCheck>_>_>
             .super__Head_base<0UL,_CCheckQueue<MemoryCheck>_*,_false>._M_head_impl,0x80,3);
  local_120 = -1;
  uVar6 = 0;
  queue._M_t.
  super___uniq_ptr_impl<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>.
  _M_t.
  super__Tuple_impl<0UL,_CCheckQueue<MemoryCheck>_*,_std::default_delete<CCheckQueue<MemoryCheck>_>_>
  .super__Head_base<0UL,_CCheckQueue<MemoryCheck>_*,_false>._M_head_impl =
       (__uniq_ptr_data<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>,_true,_true>
        )(__uniq_ptr_data<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_CCheckQueue<MemoryCheck>_*,_std::default_delete<CCheckQueue<MemoryCheck>_>_>
           .super__Head_base<0UL,_CCheckQueue<MemoryCheck>_*,_false>._M_head_impl;
  do {
    CCheckQueueControl<MemoryCheck>::CCheckQueueControl
              (&control,(CCheckQueue<FakeCheckCheckCompletion> *)
                        queue._M_t.
                        super___uniq_ptr_impl<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_CCheckQueue<MemoryCheck>_*,_std::default_delete<CCheckQueue<MemoryCheck>_>_>
                        .super__Head_base<0UL,_CCheckQueue<MemoryCheck>_*,_false>._M_head_impl);
    if (uVar6 != 0) {
      uVar4 = uVar6;
      do {
        do {
          uVar2 = RandomMixin<FastRandomContext>::randbits
                            (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).
                              super_NoLockLoggingTestingSetup.super_TestingSetup.
                              super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
                              super_RandomMixin<FastRandomContext>,4);
        } while (9 < uVar2);
        vChecks.
        super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vChecks.
        super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vChecks.
        super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (uVar2 != 0) {
          uVar5 = uVar2 - 1;
          if (uVar4 - 1 <= uVar2 - 1) {
            uVar5 = uVar4 - 1;
          }
          uVar3 = 0;
          do {
            local_100._vptr_lazy_ostream =
                 (_func_int **)
                 CONCAT71(local_100._vptr_lazy_ostream._1_7_,
                          (~(uVar6 >> 1) + uVar4 + uVar3 == 0 || local_120 + uVar4 + uVar3 == 0) ||
                          uVar3 + uVar4 == 1);
            std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::emplace_back<bool>
                      ((vector<MemoryCheck,_std::allocator<MemoryCheck>_> *)&vChecks,
                       (bool *)&local_100);
            uVar3 = uVar3 - 1;
          } while (~uVar5 != uVar3);
          uVar4 = uVar4 + uVar3;
        }
        if (control.pqueue != (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
          CCheckQueue<MemoryCheck>::Add((CCheckQueue<MemoryCheck> *)control.pqueue,&vChecks);
        }
        std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::~vector
                  ((vector<MemoryCheck,_std::allocator<MemoryCheck>_> *)&vChecks);
      } while (uVar4 != 0);
    }
    CCheckQueueControl<MemoryCheck>::~CCheckQueueControl(&control);
    local_d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x13e;
    file.m_begin = (iterator)&local_d0;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e0,msg);
    local_100.m_empty = false;
    local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = "";
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (MemoryCheck::fake_allocated_memory.super___atomic_base<unsigned_long>._M_i == 0);
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_80 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
    ;
    local_78 = "";
    vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)vChecks.
                          super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0138a1d0;
    vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    control.fDone = false;
    control.pqueue = (CCheckQueue<FakeCheckCheckCompletion> *)&PTR__lazy_ostream_01388f88;
    in_R8 = (iterator)0x2;
    in_R9 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_100,2,2,REQUIRE,0xe49ce8,(size_t)&local_80,0x13e,
               (vector<MemoryCheck,_std::allocator<MemoryCheck>_> *)&vChecks,"0U",&control);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    uVar6 = uVar6 + 1;
    local_120 = local_120 + -1;
  } while (uVar6 != 1000);
  std::unique_ptr<CCheckQueue<MemoryCheck>,_std::default_delete<CCheckQueue<MemoryCheck>_>_>::
  ~unique_ptr(&queue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Memory)
{
    auto queue = std::make_unique<Memory_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    for (size_t i = 0; i < 1000; ++i) {
        size_t total = i;
        {
            CCheckQueueControl<MemoryCheck> control(queue.get());
            while (total) {
                size_t r = m_rng.randrange(10);
                std::vector<MemoryCheck> vChecks;
                for (size_t k = 0; k < r && total; k++) {
                    total--;
                    // Each iteration leaves data at the front, back, and middle
                    // to catch any sort of deallocation failure
                    vChecks.emplace_back(total == 0 || total == i || total == i/2);
                }
                control.Add(std::move(vChecks));
            }
        }
        BOOST_REQUIRE_EQUAL(MemoryCheck::fake_allocated_memory, 0U);
    }
}